

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O3

void archive_acl_clear(archive_acl *acl)

{
  archive_acl_entry *paVar1;
  archive_acl_entry *paVar2;
  
  paVar2 = acl->acl_head;
  while (paVar2 != (archive_acl_entry *)0x0) {
    paVar1 = paVar2->next;
    archive_mstring_clean(&paVar2->name);
    free(acl->acl_head);
    acl->acl_head = paVar1;
    paVar2 = paVar1;
  }
  free(acl->acl_text_w);
  acl->acl_text_w = (wchar_t *)0x0;
  free(acl->acl_text);
  acl->acl_text = (char *)0x0;
  acl->acl_p = (archive_acl_entry *)0x0;
  acl->acl_types = L'\0';
  acl->acl_state = L'\0';
  return;
}

Assistant:

void
archive_acl_clear(struct archive_acl *acl)
{
	struct archive_acl_entry *ap;

	while (acl->acl_head != NULL) {
		ap = acl->acl_head->next;
		archive_mstring_clean(&acl->acl_head->name);
		free(acl->acl_head);
		acl->acl_head = ap;
	}
	free(acl->acl_text_w);
	acl->acl_text_w = NULL;
	free(acl->acl_text);
	acl->acl_text = NULL;
	acl->acl_p = NULL;
	acl->acl_types = 0;
	acl->acl_state = 0; /* Not counting. */
}